

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  uint uVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_c1;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
            (&(this->name_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      if ((this->identifier_value_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f1);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !identifier_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
        internal::LogMessage::~LogMessage(&local_50);
      }
      psVar2 = (this->identifier_value_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if ((this->string_value_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f5);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !string_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
        internal::LogMessage::~LogMessage(&local_88);
      }
      psVar2 = (this->string_value_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if ((this->aggregate_value_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f9);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: !aggregate_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_c1,pLVar3);
        internal::LogMessage::~LogMessage(&local_c0);
      }
      psVar2 = (this->aggregate_value_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0x38) != 0) {
    this->positive_int_value_ = 0;
    this->negative_int_value_ = 0;
    this->double_value_ = 0.0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void UninterpretedOption::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption)
  name_.Clear();
  if (_has_bits_[0 / 32] & 7u) {
    if (has_identifier_value()) {
      GOOGLE_DCHECK(!identifier_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*identifier_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_string_value()) {
      GOOGLE_DCHECK(!string_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*string_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_aggregate_value()) {
      GOOGLE_DCHECK(!aggregate_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*aggregate_value_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 56u) {
    ::memset(&positive_int_value_, 0, reinterpret_cast<char*>(&double_value_) -
      reinterpret_cast<char*>(&positive_int_value_) + sizeof(double_value_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}